

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestReloadLazyWithDifferentSearchPaths(void)

{
  _Alloc_hider _Var1;
  __type _Var2;
  int iVar3;
  Template *pTVar4;
  TemplateString *this;
  allocator local_189;
  TemplateString local_188;
  string path_a_foo;
  string path_b_foo;
  TemplateString local_128;
  string pathB;
  TemplateCache cache1;
  string pathA;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&cache1,"empty");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&cache1,(UnsafeArena *)0x0);
  ctemplate::TemplateCache::TemplateCache(&cache1);
  std::__cxx11::string::string((string *)&pathB,"a/",(allocator *)&path_b_foo);
  ctemplate::PathJoin((string *)&pathA,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string((string *)&pathB);
  std::__cxx11::string::string((string *)&path_b_foo,"b/",(allocator *)&path_a_foo);
  ctemplate::PathJoin((string *)&pathB,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string((string *)&path_b_foo);
  ctemplate::CreateOrCleanTestDir(&pathA);
  ctemplate::CreateOrCleanTestDir(&pathB);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)&cache1);
  ctemplate::TemplateCache::AddAlternateTemplateRootDirectory((string *)&cache1);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var2 = std::operator==(&path_b_foo,&pathA);
  std::__cxx11::string::~string((string *)&path_b_foo);
  if (_Var2) {
    std::__cxx11::string::string((string *)&path_a_foo,"template_foo",(allocator *)&local_188);
    ctemplate::PathJoin((string *)&path_b_foo,(string *)&pathB);
    std::__cxx11::string::~string((string *)&path_a_foo);
    std::__cxx11::string::string((string *)&path_a_foo,"b/template_foo",(allocator *)&local_188);
    ctemplate::StringToFile(&path_a_foo,&path_b_foo);
    std::__cxx11::string::~string((string *)&path_a_foo);
    _Var1 = path_b_foo._M_dataplus;
    std::__cxx11::string::string((string *)&local_188,"template_foo",(allocator *)&local_128);
    ctemplate::TemplateCache::FindTemplateFilename((string *)&path_a_foo);
    iVar3 = strcmp(_Var1._M_p,path_a_foo._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&path_a_foo);
    std::__cxx11::string::~string((string *)&local_188);
    if (iVar3 == 0) {
      ctemplate::TemplateString::TemplateString((TemplateString *)&path_a_foo,"template_foo");
      ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&path_a_foo);
      std::__cxx11::string::string((string *)&local_188,"template_foo",(allocator *)&local_128);
      ctemplate::PathJoin((string *)&path_a_foo,(string *)&pathA);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::string((string *)&local_188,"a/template_foo",(allocator *)&local_128);
      ctemplate::StringToFile((string *)&local_188,&path_a_foo);
      std::__cxx11::string::~string((string *)&local_188);
      _Var1 = path_a_foo._M_dataplus;
      std::__cxx11::string::string((string *)&local_128,"template_foo",&local_189);
      ctemplate::TemplateCache::FindTemplateFilename((string *)&local_188);
      iVar3 = strcmp(_Var1._M_p,local_188.ptr_);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_128);
      if (iVar3 == 0) {
        ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)&cache1);
        ctemplate::TemplateString::TemplateString(&local_188,"template_foo");
        pTVar4 = (Template *)
                 ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&local_188);
        std::__cxx11::string::string((string *)&local_188,"a/template_foo",(allocator *)&local_128);
        ctemplate::AssertExpandIs(pTVar4,&dict,(string *)&local_188,true);
        std::__cxx11::string::~string((string *)&local_188);
        unlink(path_a_foo._M_dataplus._M_p);
        ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)&cache1);
        ctemplate::TemplateString::TemplateString(&local_188,"template_foo");
        pTVar4 = (Template *)
                 ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&local_188);
        std::__cxx11::string::string((string *)&local_188,"b/template_foo",(allocator *)&local_128);
        ctemplate::AssertExpandIs(pTVar4,&dict,(string *)&local_188,true);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&path_a_foo);
        std::__cxx11::string::~string((string *)&path_b_foo);
        std::__cxx11::string::~string((string *)&pathB);
        std::__cxx11::string::~string((string *)&pathA);
        ctemplate::TemplateCache::~TemplateCache(&cache1);
        ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
        return;
      }
      printf("ASSERT FAILED, line %d: %s\n",0x23f,
             "strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
            );
      std::__cxx11::string::string((string *)&local_128,"template_foo",&local_189);
      ctemplate::TemplateCache::FindTemplateFilename((string *)&local_188);
      iVar3 = strcmp(path_a_foo._M_dataplus._M_p,local_188.ptr_);
      if (iVar3 != 0) {
        __assert_fail("strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x23f,
                      "static void TemplateCacheUnittest::TestReloadLazyWithDifferentSearchPaths()")
        ;
      }
      std::__cxx11::string::~string((string *)&local_188);
      this = &local_128;
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x237,
             "strcmp(path_b_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
            );
      std::__cxx11::string::string((string *)&local_188,"template_foo",(allocator *)&local_128);
      ctemplate::TemplateCache::FindTemplateFilename((string *)&path_a_foo);
      iVar3 = strcmp(path_b_foo._M_dataplus._M_p,path_a_foo._M_dataplus._M_p);
      if (iVar3 != 0) {
        __assert_fail("strcmp(path_b_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x237,
                      "static void TemplateCacheUnittest::TestReloadLazyWithDifferentSearchPaths()")
        ;
      }
      std::__cxx11::string::~string((string *)&path_a_foo);
      this = &local_188;
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x231,"cache1.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var2 = std::operator==(&path_b_foo,&pathA);
    if (!_Var2) {
      __assert_fail("cache1.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x231,
                    "static void TemplateCacheUnittest::TestReloadLazyWithDifferentSearchPaths()");
    }
    this = (TemplateString *)&path_b_foo;
  }
  std::__cxx11::string::~string((string *)this);
  exit(1);
}

Assistant:

static void TestReloadLazyWithDifferentSearchPaths() {
    // Identical test as above with but with LAZY_RELOAD
    TemplateDictionary dict("empty");
    TemplateCache cache1;
    TemplateCachePeer cache_peer(&cache1);

    const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
    const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);

    cache1.SetTemplateRootDirectory(pathA);
    cache1.AddAlternateTemplateRootDirectory(pathB);
    ASSERT(cache1.template_root_directory() == pathA);

    // Add b/foo
    const string path_b_foo = PathJoin(pathB, "template_foo");
    StringToFile("b/template_foo", path_b_foo);
    ASSERT_STREQ(path_b_foo.c_str(),
                 cache1.FindTemplateFilename("template_foo").c_str());
    // Add b/foo to the template cache.
    cache1.GetTemplate("template_foo", DO_NOT_STRIP);

    // Add a/foo
    const string path_a_foo = PathJoin(pathA, "template_foo");
    StringToFile("a/template_foo", path_a_foo);
    ASSERT_STREQ(path_a_foo.c_str(),
                 cache1.FindTemplateFilename("template_foo").c_str());

    // Now, on reload we pick up foo from the earlier search path: a/foo
    cache1.ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    const Template* foo_post_reload = cache_peer.GetTemplate("template_foo",
                                                             STRIP_WHITESPACE);
    AssertExpandIs(foo_post_reload, &dict, "a/template_foo",
                   true);

    // Delete a/foo and reload. Now we pick up the next available foo: b/foo
    unlink(path_a_foo.c_str());
    cache1.ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    foo_post_reload = cache_peer.GetTemplate("template_foo",
                                             STRIP_WHITESPACE);
    AssertExpandIs(foo_post_reload, &dict, "b/template_foo",
                   true);
  }